

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O0

int oonf_packet_send_managed_multicast
              (oonf_packet_managed *managed,void *data,size_t length,int af_type)

{
  int *piVar1;
  int af_type_local;
  size_t length_local;
  void *data_local;
  oonf_packet_managed *managed_local;
  
  if (af_type == 2) {
    managed_local._4_4_ =
         oonf_packet_send_managed(managed,&(managed->multicast_v4).local_socket,data,length);
  }
  else if (af_type == 10) {
    managed_local._4_4_ =
         oonf_packet_send_managed(managed,&(managed->multicast_v6).local_socket,data,length);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    managed_local._4_4_ = 1;
  }
  return managed_local._4_4_;
}

Assistant:

int
oonf_packet_send_managed_multicast(struct oonf_packet_managed *managed, const void *data, size_t length, int af_type) {
  if (af_type == AF_INET) {
    return oonf_packet_send_managed(managed, &managed->multicast_v4.local_socket, data, length);
  }
  else if (af_type == AF_INET6) {
    return oonf_packet_send_managed(managed, &managed->multicast_v6.local_socket, data, length);
  }
  errno = 0;
  return 1;
}